

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1359::run(TestCase1359 *this)

{
  StructDataBitCount *pSVar1;
  Reader value;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  undefined8 in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  Reader local_470;
  Reader local_440;
  Reader local_410;
  Builder local_3e0;
  Builder local_3b8;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  Reader local_360;
  Reader local_330;
  Builder local_300;
  undefined1 local_2d8 [8];
  Builder root_1;
  MallocMessageBuilder builder_1;
  Reader local_190;
  Builder local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1359 *this_local;
  
  pSVar1 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)pSVar1,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<TestImport>((Builder *)local_128,(MessageBuilder *)pSVar1);
  TestImport::Builder::initField(&local_160,(Builder *)local_128);
  builder_00._builder.capTable = (CapTableBuilder *)local_160._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_160._builder.capTable;
  builder_00._builder.data = local_160._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_160._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffb70;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffb70 >> 0x30);
  initTestMessage(builder_00);
  TestImport::Builder::asReader
            ((Reader *)&builder_1.moreSegments.builder.disposer,(Builder *)local_128);
  TestImport::Reader::getField(&local_190,(Reader *)&builder_1.moreSegments.builder.disposer);
  reader._reader.capTable = (CapTableReader *)local_190._reader.data;
  reader._reader.segment = (SegmentReader *)local_190._reader.capTable;
  reader._reader.data = local_190._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_190._reader._32_8_;
  reader._reader.dataSize = local_190._reader.nestingLimit;
  reader._reader.pointerCount = local_190._reader._44_2_;
  reader._reader._38_2_ = local_190._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffb78;
  checkTestMessage(reader);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  pSVar1 = &root_1._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)pSVar1,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<TestImport2>((Builder *)local_2d8,(MessageBuilder *)pSVar1);
  TestImport2::Builder::initFoo(&local_300,(Builder *)local_2d8);
  builder_01._builder.capTable = (CapTableBuilder *)local_300._builder.data;
  builder_01._builder.segment = (SegmentBuilder *)local_300._builder.capTable;
  builder_01._builder.data = local_300._builder.pointers;
  builder_01._builder.pointers = (WirePointer *)local_300._builder._32_8_;
  builder_01._builder.dataSize = local_190._reader.nestingLimit;
  builder_01._builder.pointerCount = local_190._reader._44_2_;
  builder_01._builder._38_2_ = local_190._reader._46_2_;
  initTestMessage(builder_01);
  TestImport2::Builder::asReader(&local_360,(Builder *)local_2d8);
  TestImport2::Reader::getFoo(&local_330,&local_360);
  reader_00._reader.capTable = (CapTableReader *)local_330._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_330._reader.capTable;
  reader_00._reader.data = local_330._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_330._reader._32_8_;
  reader_00._reader.dataSize = local_330._reader.nestingLimit;
  reader_00._reader.pointerCount = local_330._reader._44_2_;
  reader_00._reader._38_2_ = local_330._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffb78;
  checkTestMessage(reader_00);
  schemaProto<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestAllTypes::_capnpPrivate>
            ();
  value._reader.capTable = (CapTableReader *)uStack_388;
  value._reader.segment = (SegmentReader *)local_390;
  value._reader.data = (void *)local_380;
  value._reader.pointers = (WirePointer *)uStack_378;
  value._reader.dataSize = (undefined4)local_370;
  value._reader.pointerCount = local_370._4_2_;
  value._reader._38_2_ = local_370._6_2_;
  value._reader._40_8_ = uStack_368;
  TestImport2::Builder::setBar((Builder *)local_2d8,value);
  TestImport2::Builder::initBaz(&local_3e0,(Builder *)local_2d8);
  TestImport::Builder::initField(&local_3b8,&local_3e0);
  builder_02._builder.capTable = (CapTableBuilder *)local_3b8._builder.data;
  builder_02._builder.segment = (SegmentBuilder *)local_3b8._builder.capTable;
  builder_02._builder.data = local_3b8._builder.pointers;
  builder_02._builder.pointers = (WirePointer *)local_3b8._builder._32_8_;
  builder_02._builder.dataSize = (int)uStack_368;
  builder_02._builder.pointerCount = (short)((ulong)uStack_368 >> 0x20);
  builder_02._builder._38_2_ = (short)((ulong)uStack_368 >> 0x30);
  initTestMessage(builder_02);
  TestImport2::Builder::asReader(&local_470,(Builder *)local_2d8);
  TestImport2::Reader::getBaz(&local_440,&local_470);
  TestImport::Reader::getField(&local_410,&local_440);
  reader_01._reader.capTable = (CapTableReader *)local_410._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_410._reader.capTable;
  reader_01._reader.data = local_410._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_410._reader._32_8_;
  reader_01._reader.dataSize = local_410._reader.nestingLimit;
  reader_01._reader.pointerCount = local_410._reader._44_2_;
  reader_01._reader._38_2_ = local_410._reader._46_2_;
  reader_01._reader._40_8_ = in_stack_fffffffffffffb78;
  checkTestMessage(reader_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_1._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, Imports) {
  // Also just testing the generated code.

  {
    MallocMessageBuilder builder;
    TestImport::Builder root = builder.getRoot<TestImport>();
    initTestMessage(root.initField());
    checkTestMessage(root.asReader().getField());
  }

  {
    MallocMessageBuilder builder;
    TestImport2::Builder root = builder.getRoot<TestImport2>();
    initTestMessage(root.initFoo());
    checkTestMessage(root.asReader().getFoo());
    root.setBar(schemaProto<TestAllTypes>());
    initTestMessage(root.initBaz().initField());
    checkTestMessage(root.asReader().getBaz().getField());
  }
}